

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterBuilder.cpp
# Opt level: O0

ParameterSymbolBase * __thiscall
slang::ast::ParameterBuilder::createParam
          (ParameterBuilder *this,ParameterDecl *decl,Scope *newScope,SourceLocation instanceLoc)

{
  long lVar1;
  LookupLocation lookupLocation;
  LookupLocation lookupLocation_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view arg;
  long *plVar2;
  bool bVar3;
  SyntaxNode *pSVar4;
  Type *pTVar5;
  DataTypeSyntax *pDVar6;
  equal_to<const_slang::syntax::SyntaxNode_*> *this_00;
  raw_key_type *__y;
  ExpressionSyntax *pEVar7;
  undefined8 *puVar8;
  long *in_RSI;
  undefined8 *in_RDI;
  const_iterator it_1;
  SyntaxNode *paramSyntax;
  DeclaredType *declType;
  ParameterSymbol *local_res238;
  NamedTypeSyntax *namedType;
  NameSyntax *nameSyntax;
  DeclaredType *tt;
  TypeParameterSymbol *param;
  ForwardTypeRestriction typeRestriction;
  iterator it;
  bool isFromConfig;
  ExpressionSyntax *newInitializer;
  Compilation *comp;
  anon_class_8_1_3953ce12 handlePreviewNodes;
  anon_class_16_2_b10c6898 reportError;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  ValueSymbol *in_stack_fffffffffffffaa8;
  DeclaredType *pDVar9;
  ValueSymbol *in_stack_fffffffffffffab0;
  Scope *scope;
  ValueSymbol *in_stack_fffffffffffffab8;
  undefined1 uVar10;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffac0;
  ParameterSymbol *newValue;
  Compilation *in_stack_fffffffffffffac8;
  Compilation *compilation;
  ParameterSymbol *in_stack_fffffffffffffad0;
  ParameterSymbol *this_01;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  Symbol *in_stack_fffffffffffffae0;
  ParameterSymbol *in_stack_fffffffffffffae8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffaf0;
  Scope *in_stack_fffffffffffffaf8;
  BumpAllocator *in_stack_fffffffffffffb00;
  SyntaxNode **ppSVar11;
  ForwardTypeRestriction *in_stack_fffffffffffffb10;
  Scope *in_stack_fffffffffffffb50;
  SourceLocation in_stack_fffffffffffffb58;
  DeclaredType *pDVar12;
  DeclaredType *in_stack_fffffffffffffb60;
  DiagCode code;
  bitmask<slang::ast::ASTFlags> local_438;
  unsigned_long local_430;
  unsigned_long local_428;
  undefined1 local_3e8 [112];
  SourceLocation local_378;
  table_element_pointer local_370;
  undefined1 local_368 [36];
  bitmask<slang::ast::DeclaredTypeFlags> local_344 [11];
  bitmask<slang::ast::ASTFlags> local_318 [12];
  Token local_2b8;
  SourceLocation local_2a8;
  undefined4 local_29c;
  Symbol *local_298;
  SyntaxNode *local_290;
  bitmask<slang::ast::DeclaredTypeFlags> local_284;
  DeclaredType *local_280;
  long local_278;
  long local_270;
  TypeParameterSymbol *local_268;
  undefined1 local_25c [36];
  char_pointer local_238;
  table_element_pointer local_230;
  byte local_221;
  SyntaxNode *local_220;
  Compilation *local_218;
  undefined1 *local_200;
  long *local_1f0;
  undefined1 local_1e0 [8];
  ParameterSymbolBase *local_1d8;
  long *local_1d0;
  undefined8 *local_1c8;
  char_pointer local_1c0;
  table_element_pointer local_1b8;
  SyntaxNode **local_1b0;
  long local_1a8;
  SourceLocation local_1a0;
  table_element_pointer local_198;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
  local_190;
  long *local_178;
  undefined8 *local_170;
  iterator local_168;
  size_t local_158;
  long *local_150;
  undefined8 *local_148;
  uint local_13c;
  value_type *local_138;
  value_type *local_130;
  uint local_124;
  group_type *local_120;
  size_t local_118;
  pow2_quadratic_prober local_110;
  size_t local_100;
  size_t local_f8;
  long *local_f0;
  undefined8 *local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  SyntaxNode **local_d0;
  long local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
  local_b0;
  SyntaxNode **local_98;
  long local_90;
  iterator local_88;
  size_t local_78;
  SyntaxNode **local_70;
  long local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  SyntaxNode **local_10;
  long local_8;
  
  local_200 = local_1e0;
  local_1f0 = in_RSI;
  local_218 = Scope::getCompilation((Scope *)*in_RDI);
  local_220 = (SyntaxNode *)0x0;
  local_221 = 0;
  puVar8 = in_RDI + 0x27;
  local_1d0 = local_1f0 + 2;
  local_1c8 = puVar8;
  local_178 = local_1d0;
  local_170 = puVar8;
  local_150 = local_1d0;
  local_148 = puVar8;
  local_158 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          *)in_stack_fffffffffffffab0,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffaa8);
  plVar2 = local_150;
  local_f8 = boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
             ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                             *)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8);
  local_f0 = plVar2;
  local_100 = local_158;
  local_e8 = puVar8;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_110,local_f8);
  do {
    local_118 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_110);
    local_120 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                          *)0x66bf82);
    local_120 = local_120 + local_118;
    local_124 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffab8,(size_t)in_stack_fffffffffffffab0);
    if (local_124 != 0) {
      local_130 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                              *)0x66bfd4);
      local_138 = local_130 + local_118 * 0xf;
      do {
        local_13c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
                *)0x66c027);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>
                    *)0x66c05a);
        bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           in_stack_fffffffffffffad0,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffac8,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffac0.m_bits);
        if (bVar3) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
          ::table_locator(&local_190,local_120,local_13c,local_138 + local_13c);
          goto LAB_0066c157;
        }
        local_124 = local_124 - 1 & local_124;
      } while (local_124 != 0);
    }
    bVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8);
    if (bVar3) {
      memset(&local_190,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
      ::table_locator(&local_190);
      goto LAB_0066c157;
    }
    bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_110,in_RDI[0x29]);
  } while (bVar3);
  memset(&local_190,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>_>
  ::table_locator(&local_190);
LAB_0066c157:
  local_168 = boost::unordered::detail::foa::
              table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
              ::make_iterator((locator *)0x66c164);
  local_1c0 = local_168.pc_;
  local_1b8 = local_168.p_;
  local_238 = local_168.pc_;
  local_230 = local_168.p_;
  local_25c._20_16_ =
       (undefined1  [16])
       boost::unordered::
       unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
       ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_256UL,_16UL>_>
              *)0x66c1cc);
  bVar3 = boost::unordered::detail::foa::operator!=
                    ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffab0,
                     (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                      *)in_stack_fffffffffffffaa8);
  if (bVar3) {
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  *)in_stack_fffffffffffffab0);
    std::tie<slang::syntax::ExpressionSyntax_const*,bool>
              ((ExpressionSyntax **)in_stack_fffffffffffffab8,(bool *)in_stack_fffffffffffffab0);
    std::tuple<slang::syntax::ExpressionSyntax_const*&,bool&>::operator=
              ((tuple<const_slang::syntax::ExpressionSyntax_*&,_bool_&> *)
               in_stack_fffffffffffffac0.m_bits,
               (pair<const_slang::syntax::ExpressionSyntax_*,_bool> *)in_stack_fffffffffffffab8);
  }
  if ((*(byte *)(local_1f0 + 7) & 1) == 0) {
    local_344._36_8_ =
         BumpAllocator::
         emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&>
                   ((BumpAllocator *)in_stack_fffffffffffffae0,
                    (basic_string_view<char,_std::char_traits<char>_> *)
                    CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                    (SourceLocation *)in_stack_fffffffffffffad0,(bool *)in_stack_fffffffffffffac8,
                    (bool *)in_stack_fffffffffffffac0.m_bits);
    local_344._20_8_ = local_1f0[5];
    local_344._28_8_ = local_1f0[6];
    syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffaf0._M_extent_value;
    syntax_00._M_ptr = (pointer)in_stack_fffffffffffffae8;
    Symbol::setAttributes
              (in_stack_fffffffffffffae0,
               (Scope *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),syntax_00);
    if ((*(byte *)((long)local_1f0 + 0x3b) & 1) != 0) {
      *(SyntaxNode **)(local_344._36_8_ + 0x158) = (SyntaxNode *)local_1f0[1];
      createParam::anon_class_8_1_3953ce12::operator()
                ((anon_class_8_1_3953ce12 *)in_stack_fffffffffffffab0,
                 (SyntaxNode *)in_stack_fffffffffffffaa8);
    }
    local_344._4_8_ = ValueSymbol::getDeclaredType(in_stack_fffffffffffffaa8);
    local_344._12_8_ =
         not_null<slang::ast::DeclaredType_*>::operator*
                   ((not_null<slang::ast::DeclaredType_*> *)0x66c96c);
    if (local_220 != (SyntaxNode *)0x0) {
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(local_344,InitializerOverridden);
      DeclaredType::addFlags
                ((DeclaredType *)in_stack_fffffffffffffaa8,
                 (bitmask<slang::ast::DeclaredTypeFlags>)
                 (underlying_type)((ulong)in_stack_fffffffffffffab0 >> 0x20));
    }
    if ((*(byte *)((long)local_1f0 + 0x3b) & 1) == 0) {
      ValueSymbol::setType(in_stack_fffffffffffffab0,(Type *)in_stack_fffffffffffffaa8);
      if (local_1f0[1] != 0) {
        ValueSymbol::setInitializer
                  (in_stack_fffffffffffffab0,(Expression *)in_stack_fffffffffffffaa8);
      }
    }
    else {
      not_null<slang::syntax::DataTypeSyntax_*>::operator*
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x66ca35);
      ValueSymbol::setDeclaredType
                (in_stack_fffffffffffffab0,(DataTypeSyntax *)in_stack_fffffffffffffaa8);
      ValueSymbol::setFromDeclarator
                (in_stack_fffffffffffffab0,(DeclaratorSyntax *)in_stack_fffffffffffffaa8);
    }
    if (local_220 != (SyntaxNode *)0x0) {
      local_368._8_16_ =
           (undefined1  [16])
           slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffae0);
      local_368._24_8_ = parsing::Token::location((Token *)(local_368 + 8));
      ValueSymbol::setInitializerSyntax
                (in_stack_fffffffffffffab8,(ExpressionSyntax *)in_stack_fffffffffffffab0,
                 (SourceLocation)in_stack_fffffffffffffac0.m_bits);
    }
    Scope::addMember((Scope *)in_stack_fffffffffffffab0,&in_stack_fffffffffffffaa8->super_Symbol);
    local_368._0_8_ = Symbol::getSyntax((Symbol *)local_344._36_8_);
    if (((in_RDI[0x2f] != 0) && ((SyntaxNode *)local_368._0_8_ != (SyntaxNode *)0x0)) &&
       ((local_221 & 1) == 0)) {
      lVar1 = in_RDI[0x2f];
      local_1b0 = (SyntaxNode **)local_368;
      local_1a8 = lVar1;
      local_d0 = local_1b0;
      local_c8 = lVar1;
      local_98 = local_1b0;
      local_90 = lVar1;
      local_70 = local_1b0;
      local_68 = lVar1;
      local_78 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                 ::hash_for<slang::syntax::SyntaxNode_const*>
                           ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                             *)in_stack_fffffffffffffab0,(SyntaxNode **)in_stack_fffffffffffffaa8);
      ppSVar11 = local_70;
      local_18 = boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                 *)in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8);
      local_20 = local_78;
      local_10 = ppSVar11;
      local_8 = lVar1;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_30,local_18);
      do {
        local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
        local_40 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                   ::groups((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                             *)0x66cc70);
        local_40 = local_40 + local_38;
        local_44 = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffffab8,(size_t)in_stack_fffffffffffffab0);
        if (local_44 != 0) {
          local_50 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                     ::elements((table_arrays<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                 *)0x66ccbb);
          local_58 = local_50 + local_38 * 0xf;
          do {
            local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
            this_00 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                              *)0x66cd0b);
            ppSVar11 = local_10;
            __y = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                  ::
                  key_from<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>
                            ((pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>
                              *)0x66cd38);
            bVar3 = std::equal_to<const_slang::syntax::SyntaxNode_*>::operator()
                              (this_00,ppSVar11,__y);
            if (bVar3) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
              ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
              goto LAB_0066ce2c;
            }
            local_44 = local_44 - 1 & local_44;
          } while (local_44 != 0);
        }
        bVar3 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffffab0,(size_t)in_stack_fffffffffffffaa8);
        if (bVar3) {
          memset(&local_b0,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
          ::table_locator(&local_b0);
          goto LAB_0066ce2c;
        }
        bVar3 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_30,*(size_t *)(lVar1 + 8));
      } while (bVar3);
      memset(&local_b0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>
      ::table_locator(&local_b0);
LAB_0066ce2c:
      local_88 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                 ::make_iterator((locator *)0x66ce39);
      local_e0.pc_ = local_88.pc_;
      local_e0.p_ = local_88.p_;
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
      local_1a0 = (SourceLocation)local_c0.pc_;
      local_198 = local_c0.p_;
      local_378 = (SourceLocation)local_c0.pc_;
      local_370 = local_c0.p_;
      local_3e8._96_16_ =
           (undefined1  [16])
           boost::unordered::
           unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
           ::end((unordered_flat_map<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>,_slang::hash<const_slang::syntax::SyntaxNode_*,_void>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                  *)0x66ced2);
      bVar3 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffab0,
                         (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffffaa8);
      uVar10 = (undefined1)((ulong)in_stack_fffffffffffffab8 >> 0x38);
      if (bVar3) {
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)in_stack_fffffffffffffab0);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffab0,
                   (ConstantValue *)in_stack_fffffffffffffaa8);
        ParameterSymbol::setValue
                  (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                   (ConstantValue *)in_stack_fffffffffffffac0.m_bits,(bool)uVar10);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x66cf68);
        return (ParameterSymbolBase *)(local_344._36_8_ + 0x150);
      }
    }
    uVar10 = (undefined1)((ulong)in_stack_fffffffffffffab8 >> 0x38);
    bVar3 = ParameterSymbolBase::isLocalParam((ParameterSymbolBase *)(local_344._36_8_ + 0x150));
    if (!bVar3) {
      if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
        if (local_220 == (SyntaxNode *)0x0) {
          bVar3 = ParameterSymbolBase::isPortParam
                            ((ParameterSymbolBase *)(local_344._36_8_ + 0x150));
          if ((bVar3) &&
             (pEVar7 = DeclaredType::getInitializerSyntax((DeclaredType *)local_344._12_8_),
             pEVar7 == (ExpressionSyntax *)0x0)) {
            createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
            ::$_0::operator()((anon_class_16_2_b10c6898 *)in_stack_fffffffffffffaf0._M_extent_value,
                              in_stack_fffffffffffffae8);
          }
        }
        else if ((local_221 & 1) == 0) {
          if (in_RDI[0x2e] != 0) {
            DeclaredType::resolveAt
                      (in_stack_fffffffffffffb60,(ASTContext *)in_stack_fffffffffffffb58);
          }
        }
        else {
          ParameterSymbol::setIsFromConfig((ParameterSymbol *)local_344._36_8_,true);
          scope = (Scope *)in_RDI[0x30];
          local_430 = LookupLocation::max;
          local_428 = DAT_00fffd90;
          pDVar9 = (DeclaredType *)local_344._12_8_;
          bitmask<slang::ast::ASTFlags>::bitmask(&local_438,ConfigParam);
          lookupLocation_00._8_8_ = in_stack_fffffffffffffad0;
          lookupLocation_00.scope = (Scope *)in_stack_fffffffffffffac8;
          ASTContext::ASTContext
                    ((ASTContext *)pDVar9,scope,lookupLocation_00,in_stack_fffffffffffffac0);
          DeclaredType::resolveAt(in_stack_fffffffffffffb60,(ASTContext *)in_stack_fffffffffffffb58)
          ;
        }
      }
      else {
        this_01 = (ParameterSymbol *)local_3e8;
        newValue = (ParameterSymbol *)local_344._36_8_;
        compilation = local_218;
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
        ParameterSymbol::setValue(this_01,compilation,(ConstantValue *)newValue,(bool)uVar10);
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x66d037);
      }
    }
    local_1d8 = (ParameterSymbolBase *)(local_344._36_8_ + 0x150);
  }
  else {
    local_25c._0_4_ = None;
    if ((((*(byte *)((long)local_1f0 + 0x3b) & 1) != 0) && (*local_1f0 != 0)) &&
       (*(long *)(*local_1f0 + 0x38) != 0)) {
      local_25c._0_4_ =
           SemanticFacts::getTypeRestriction(*(ForwardTypeRestrictionSyntax **)(*local_1f0 + 0x38));
    }
    code = SUB84((ulong)in_stack_fffffffffffffb60 >> 0x20,0);
    pDVar9 = (DeclaredType *)local_25c;
    local_268 = BumpAllocator::
                emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,bool_const&,bool_const&,slang::ast::ForwardTypeRestriction&>
                          (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffffaf0._M_extent_value,
                           (SourceLocation *)in_stack_fffffffffffffae8,
                           (bool *)in_stack_fffffffffffffae0,
                           (bool *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                           in_stack_fffffffffffffb10);
    local_278 = local_1f0[5];
    local_270 = local_1f0[6];
    syntax._M_extent._M_extent_value = in_stack_fffffffffffffaf0._M_extent_value;
    syntax._M_ptr = (pointer)in_stack_fffffffffffffae8;
    Symbol::setAttributes
              (in_stack_fffffffffffffae0,
               (Scope *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),syntax);
    if ((((*(byte *)((long)local_1f0 + 0x3b) & 1) != 0) &&
        (createParam::anon_class_8_1_3953ce12::operator()
                   ((anon_class_8_1_3953ce12 *)in_stack_fffffffffffffab0,(SyntaxNode *)pDVar9),
        local_1f0[1] != 0)) && (*(long *)(local_1f0[1] + 0x28) != 0)) {
      pSVar4 = (SyntaxNode *)
               not_null::operator_cast_to_DataTypeSyntax_
                         ((not_null<slang::syntax::DataTypeSyntax_*> *)0x66c3ad);
      (local_268->super_ParameterSymbolBase).defaultValSyntax = pSVar4;
    }
    pDVar12 = &local_268->targetType;
    local_280 = pDVar12;
    if (local_220 == (SyntaxNode *)0x0) {
      if ((*(byte *)((long)local_1f0 + 0x3b) & 1) == 0) {
        if (*local_1f0 == 0) {
          pTVar5 = Compilation::getErrorType(local_218);
          DeclaredType::setType(pDVar12,pTVar5);
        }
        else {
          DeclaredType::setType(pDVar12,(Type *)*local_1f0);
        }
      }
      else {
        Symbol::setSyntax(&local_268->super_Symbol,(SyntaxNode *)local_1f0[1]);
        if (*(long *)(local_1f0[1] + 0x28) == 0) {
          pDVar12 = local_280;
          pTVar5 = Compilation::getErrorType(local_218);
          DeclaredType::setType(pDVar12,pTVar5);
        }
        else {
          pDVar12 = local_280;
          pDVar6 = not_null<slang::syntax::DataTypeSyntax_*>::operator*
                             ((not_null<slang::syntax::DataTypeSyntax_*> *)0x66c659);
          DeclaredType::setTypeSyntax(pDVar12,pDVar6);
        }
      }
    }
    else {
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_284,TypeOverridden);
      DeclaredType::addFlags
                (pDVar9,(bitmask<slang::ast::DeclaredTypeFlags>)
                        (underlying_type)((ulong)in_stack_fffffffffffffab0 >> 0x20));
      bVar3 = slang::syntax::NameSyntax::isKind(local_220->kind);
      if (bVar3) {
        local_290 = (SyntaxNode *)
                    slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>(local_220);
        local_298 = (Symbol *)
                    BumpAllocator::
                    emplace<slang::syntax::NamedTypeSyntax,slang::syntax::NameSyntax&>
                              ((BumpAllocator *)in_stack_fffffffffffffab0,(NameSyntax *)pDVar9);
        DeclaredType::setTypeSyntax(local_280,(DataTypeSyntax *)local_298);
      }
      else {
        bVar3 = slang::syntax::DataTypeSyntax::isKind(local_220->kind);
        pDVar12 = local_280;
        if (bVar3) {
          pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DataTypeSyntax>(local_220);
          DeclaredType::setTypeSyntax(pDVar12,pDVar6);
        }
        else {
          pTVar5 = Compilation::getErrorType(local_218);
          DeclaredType::setType(pDVar12,pTVar5);
          local_29c = 0x60006;
          local_2b8 = slang::syntax::SyntaxNode::getFirstToken
                                ((SyntaxNode *)in_stack_fffffffffffffae0);
          local_2a8 = parsing::Token::location(&local_2b8);
          Scope::addDiag(in_stack_fffffffffffffb50,code,in_stack_fffffffffffffb58);
          local_318[10].m_bits = (local_268->super_Symbol).name._M_len;
          local_318[0xb].m_bits = (underlying_type)(local_268->super_Symbol).name._M_str;
          arg._M_str = (char *)in_stack_fffffffffffffb00;
          arg._M_len = (size_t)in_stack_fffffffffffffaf8;
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffaf0._M_extent_value,arg);
        }
      }
    }
    Scope::addMember((Scope *)in_stack_fffffffffffffab0,(Symbol *)pDVar9);
    bVar3 = ParameterSymbolBase::isLocalParam(&local_268->super_ParameterSymbolBase);
    if (!bVar3) {
      if ((*(byte *)(in_RDI + 0x31) & 1) == 0) {
        if (local_220 == (SyntaxNode *)0x0) {
          bVar3 = ParameterSymbolBase::isPortParam(&local_268->super_ParameterSymbolBase);
          if (((bVar3) &&
              (pDVar6 = DeclaredType::getTypeSyntax(local_280), pDVar6 == (DataTypeSyntax *)0x0)) &&
             (((*(byte *)((long)local_1f0 + 0x3b) & 1) != 0 || (*local_1f0 == 0)))) {
            createParam(slang::ast::DefinitionSymbol::ParameterDecl_const&,slang::ast::Scope&,slang::SourceLocation)
            ::$_0::operator()((anon_class_16_2_b10c6898 *)in_stack_fffffffffffffaf0._M_extent_value,
                              (TypeParameterSymbol *)in_stack_fffffffffffffae8);
          }
        }
        else if ((local_221 & 1) == 0) {
          if (in_RDI[0x2e] != 0) {
            DeclaredType::forceResolveAt
                      ((DeclaredType *)in_stack_fffffffffffffab0,(ASTContext *)pDVar9);
          }
        }
        else {
          local_318[1].m_bits = LookupLocation::max;
          local_318[2].m_bits = DAT_00fffd90;
          bitmask<slang::ast::ASTFlags>::bitmask(local_318,ConfigParam);
          lookupLocation._8_8_ = in_stack_fffffffffffffad0;
          lookupLocation.scope = (Scope *)in_stack_fffffffffffffac8;
          ASTContext::ASTContext
                    ((ASTContext *)in_stack_fffffffffffffab8,(Scope *)in_stack_fffffffffffffab0,
                     lookupLocation,in_stack_fffffffffffffac0);
          DeclaredType::forceResolveAt
                    ((DeclaredType *)in_stack_fffffffffffffab0,(ASTContext *)pDVar9);
        }
      }
      else {
        pDVar9 = local_280;
        pTVar5 = Compilation::getErrorType(local_218);
        DeclaredType::setType(pDVar9,pTVar5);
      }
    }
    local_1d8 = &local_268->super_ParameterSymbolBase;
  }
  return local_1d8;
}

Assistant:

const ParameterSymbolBase& ParameterBuilder::createParam(
    const DefinitionSymbol::ParameterDecl& decl, Scope& newScope, SourceLocation instanceLoc) {

    auto reportError = [&](auto& param) {
        anyErrors = true;
        if (!suppressErrors && !param.name.empty()) {
            auto& diag = scope.addDiag(diag::ParamHasNoValue, instanceLoc);
            diag << definitionName;
            diag << param.name;
        }
    };

    auto handlePreviewNodes = [&](const SyntaxNode& syntax) {
        // Two cases where we might have enum definitions to catch
        // via the preview nodes; for parameter decl members,
        // we need to look at the parent, and for port lists we
        // should just look at the param itself.
        if (syntax.previewNode)
            newScope.addMembers(*syntax.previewNode);

        if (syntax.parent->kind == SyntaxKind::ParameterDeclarationStatement &&
            syntax.parent->previewNode) {
            newScope.addMembers(*syntax.parent->previewNode);
        }
    };

    auto& comp = scope.getCompilation();
    const ExpressionSyntax* newInitializer = nullptr;
    bool isFromConfig = false;
    if (auto it = assignments.find(decl.name); it != assignments.end())
        std::tie(newInitializer, isFromConfig) = it->second;

    if (decl.isTypeParam) {
        auto typeRestriction = ForwardTypeRestriction::None;
        if (decl.hasSyntax && decl.typeSyntax && decl.typeSyntax->typeRestriction)
            typeRestriction = SemanticFacts::getTypeRestriction(*decl.typeSyntax->typeRestriction);

        auto param = comp.emplace<TypeParameterSymbol>(newScope, decl.name, decl.location,
                                                       decl.isLocalParam, decl.isPortParam,
                                                       typeRestriction);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            handlePreviewNodes(*decl.typeSyntax);
            if (decl.typeDecl && decl.typeDecl->assignment)
                param->defaultValSyntax = decl.typeDecl->assignment->type;
        }

        auto& tt = param->targetType;
        if (newInitializer) {
            // If this is a NameSyntax, the parser didn't know we were assigning to
            // a type parameter, so fix it up into a NamedTypeSyntax to get a type from it.
            tt.addFlags(DeclaredTypeFlags::TypeOverridden);
            if (NameSyntax::isKind(newInitializer->kind)) {
                // const_cast is ugly but safe here, we're only going to refer to it
                // by const reference everywhere down.
                auto& nameSyntax = const_cast<NameSyntax&>(newInitializer->as<NameSyntax>());
                auto namedType = comp.emplace<NamedTypeSyntax>(nameSyntax);

                tt.setTypeSyntax(*namedType);
            }
            else if (!DataTypeSyntax::isKind(newInitializer->kind)) {
                tt.setType(comp.getErrorType());
                scope.addDiag(diag::BadTypeParamExpr, newInitializer->getFirstToken().location())
                    << param->name;
            }
            else {
                tt.setTypeSyntax(newInitializer->as<DataTypeSyntax>());
            }
        }
        else if (!decl.hasSyntax) {
            if (decl.givenType)
                tt.setType(*decl.givenType);
            else
                tt.setType(comp.getErrorType());
        }
        else {
            SLANG_ASSERT(decl.typeDecl);
            param->setSyntax(*decl.typeDecl);
            if (decl.typeDecl->assignment)
                tt.setTypeSyntax(*decl.typeDecl->assignment->type);
            else
                tt.setType(comp.getErrorType());
        }

        newScope.addMember(*param);

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                tt.setType(comp.getErrorType());
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    tt.forceResolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    tt.forceResolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !tt.getTypeSyntax() &&
                     (decl.hasSyntax || !decl.givenType)) {
                reportError(*param);
            }
        }

        return *param;
    }
    else {
        auto param = comp.emplace<ParameterSymbol>(decl.name, decl.location, decl.isLocalParam,
                                                   decl.isPortParam);
        param->setAttributes(scope, decl.attributes);

        if (decl.hasSyntax) {
            param->defaultValSyntax = decl.valueDecl;
            handlePreviewNodes(*decl.valueSyntax);
        }

        auto& declType = *param->getDeclaredType();
        if (newInitializer)
            declType.addFlags(DeclaredTypeFlags::InitializerOverridden);

        if (!decl.hasSyntax) {
            SLANG_ASSERT(decl.givenType);
            param->setType(*decl.givenType);
            if (decl.givenInitializer)
                param->setInitializer(*decl.givenInitializer);
        }
        else {
            SLANG_ASSERT(decl.valueSyntax);
            SLANG_ASSERT(decl.valueDecl);

            param->setDeclaredType(*decl.valueSyntax->type);
            param->setFromDeclarator(*decl.valueDecl);
        }

        if (newInitializer) {
            param->setInitializerSyntax(*newInitializer,
                                        newInitializer->getFirstToken().location());
        }

        newScope.addMember(*param);

        // If there is an override node, see if this parameter is in it.
        // Note that we ignore the override node if this is from a configuration,
        // as the LRM says config overrides take precedence over defparams.
        if (auto paramSyntax = param->getSyntax(); overrideNode && paramSyntax && !isFromConfig) {
            if (auto it = overrideNode->paramOverrides.find(paramSyntax);
                it != overrideNode->paramOverrides.end()) {
                param->setValue(comp, it->second.first, /* needsCoercion */ true);
                return *param;
            }
        }

        if (!param->isLocalParam()) {
            if (forceInvalidValues) {
                param->setValue(comp, nullptr, /* needsCoercion */ false);
            }
            else if (newInitializer) {
                if (isFromConfig) {
                    SLANG_ASSERT(configScope);
                    param->setIsFromConfig(true);
                    declType.resolveAt(
                        ASTContext(*configScope, LookupLocation::max, ASTFlags::ConfigParam));
                }
                else if (instanceContext) {
                    declType.resolveAt(*instanceContext);
                }
            }
            else if (param->isPortParam() && !declType.getInitializerSyntax()) {
                reportError(*param);
            }
        }

        return *param;
    }
}